

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  bool bVar1;
  TargetType TVar2;
  char *in_name;
  bool local_15a;
  bool local_159;
  bool local_129;
  undefined1 local_128 [8];
  string lib;
  undefined1 local_100 [7];
  bool implib;
  Item local_e0;
  Item local_b0;
  undefined1 local_80 [8];
  string exe;
  undefined1 local_50 [8];
  string linkItem;
  bool impexe;
  string *config;
  cmGeneratorTarget *tgt_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  local_129 = false;
  if (tgt != (cmGeneratorTarget *)0x0) {
    local_129 = cmGeneratorTarget::IsExecutableWithExports(tgt);
  }
  linkItem.field_2._M_local_buf[0xf] = local_129;
  if (((local_129 == false) || ((this->UseImportLibrary & 1U) != 0)) ||
     (this->LoaderFlag != (char *)0x0)) {
    if ((tgt == (cmGeneratorTarget *)0x0) || (bVar1 = cmGeneratorTarget::IsLinkable(tgt), !bVar1)) {
      in_name = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory(item);
        if (bVar1) {
          AddDirectoryItem(this,item);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,item);
          AddFullItem(this,item);
          AddLibraryRuntimeInfo(this,item);
        }
      }
      else {
        AddUserItem(this,item,true);
      }
    }
    else if (((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) || (this->LoaderFlag == (char *)0x0))
    {
      TVar2 = cmGeneratorTarget::GetType(tgt);
      if (TVar2 == INTERFACE_LIBRARY) {
        std::__cxx11::string::string((string *)local_100);
        Item::Item(&local_e0,(string *)local_100,true,tgt);
        std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
        ::push_back(&this->Items,&local_e0);
        Item::~Item(&local_e0);
        std::__cxx11::string::~string((string *)local_100);
      }
      else {
        local_159 = false;
        if ((this->UseImportLibrary & 1U) != 0) {
          local_15a = true;
          if ((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) {
            TVar2 = cmGeneratorTarget::GetType(tgt);
            local_15a = TVar2 == SHARED_LIBRARY;
          }
          local_159 = local_15a;
        }
        lib.field_2._M_local_buf[0xf] = local_159;
        cmGeneratorTarget::GetFullPath((string *)local_128,tgt,&this->Config,local_159,true);
        if (((this->LinkDependsNoShared & 1U) == 0) ||
           (TVar2 = cmGeneratorTarget::GetType(tgt), TVar2 != SHARED_LIBRARY)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,(value_type *)local_128);
        }
        AddTargetItem(this,(string *)local_128,tgt);
        AddLibraryRuntimeInfo(this,(string *)local_128,tgt);
        std::__cxx11::string::~string((string *)local_128);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_50);
      std::__cxx11::string::operator=((string *)local_50,this->LoaderFlag);
      cmGeneratorTarget::GetFullPath
                ((string *)local_80,tgt,&this->Config,(bool)(this->UseImportLibrary & 1),true);
      std::__cxx11::string::operator+=((string *)local_50,(string *)local_80);
      Item::Item(&local_b0,(string *)local_50,true,tgt);
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      push_back(&this->Items,&local_b0);
      Item::~Item(&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Depends,(value_type *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if(impexe && !this->UseImportLibrary && !this->LoaderFlag)
    {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
    }

  if(tgt && tgt->IsLinkable())
    {
    // This is a CMake target.  Ask the target for its real name.
    if(impexe && this->LoaderFlag)
      {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;

      std::string exe = tgt->GetFullPath(config, this->UseImportLibrary,
                                         true);
      linkItem += exe;
      this->Items.push_back(Item(linkItem, true, tgt));
      this->Depends.push_back(exe);
      }
    else if(tgt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.push_back(Item(std::string(), true, tgt));
      }
    else
      {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmState::SHARED_LIBRARY));

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, implib, true);
      if(!this->LinkDependsNoShared ||
         tgt->GetType() != cmState::SHARED_LIBRARY)
        {
        this->Depends.push_back(lib);
        }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
      }
    }
  else
    {
    // This is not a CMake target.  Use the name given.
    if(cmSystemTools::FileIsFullPath(item.c_str()))
      {
      if(cmSystemTools::FileIsDirectory(item))
        {
        // This is a directory.
        this->AddDirectoryItem(item);
        }
      else
        {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
        }
      }
    else
      {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
      }
    }
}